

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_lib.cc
# Opt level: O1

void __thiscall
bssl::DTLSTimer::StartMicroseconds(DTLSTimer *this,OPENSSL_timeval now,uint64_t microseconds)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint64_t uVar5;
  
  iVar2 = (int)microseconds + (int)(microseconds / 1000000) * -1000000;
  uVar1 = iVar2 + now.tv_usec;
  uVar4 = (microseconds / 1000000 + 1) - (ulong)(uVar1 < 1000000);
  uVar3 = iVar2 + -1000000 + now.tv_usec;
  if (uVar1 < 1000000) {
    uVar3 = uVar1;
  }
  uVar5 = uVar4 + now.tv_sec;
  if (CARRY8(uVar4,now.tv_sec)) {
    uVar3 = 0;
    uVar5 = 0;
  }
  (this->expire_time_).tv_sec = uVar5;
  (this->expire_time_).tv_usec = uVar3;
  return;
}

Assistant:

void DTLSTimer::StartMicroseconds(OPENSSL_timeval now, uint64_t microseconds) {
  uint64_t seconds = microseconds / 1000000;
  microseconds %= 1000000;

  now.tv_usec += microseconds;
  if (now.tv_usec >= 1000000) {
    now.tv_usec -= 1000000;
    seconds++;
  }

  if (now.tv_sec > UINT64_MAX - seconds) {
    Stop();
    return;
  }
  now.tv_sec += seconds;
  expire_time_ = now;
}